

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O2

void __thiscall
PeptData::PeptData(PeptData *this,ProtData *proteins,EnzymeType enzyme_type,uint max_miss_cleavage,
                  double min_mass,double max_mass)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer pPVar1;
  pointer pPVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  pointer pPVar6;
  Protein *protein;
  Protein *protein_00;
  uint uVar7;
  char cVar8;
  long lVar9;
  int iVar10;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  vector<PPData::Peptide,std::allocator<PPData::Peptide>> *local_178;
  unordered_map<char,_double,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_double>_>_>
  *local_170;
  Protein *local_168;
  unordered_set<PPData::Peptide,_std::hash<PPData::Peptide>,_std::equal_to<PPData::Peptide>,_std::allocator<PPData::Peptide>_>
  pool;
  
  this->enzyme_type_ = enzyme_type;
  this->max_miss_cleavage_ = max_miss_cleavage;
  this->min_mass_ = min_mass;
  this->max_mass_ = max_mass;
  this_00 = &this->compact_sequences_;
  local_178 = (vector<PPData::Peptide,std::allocator<PPData::Peptide>> *)&this->peptides_;
  (this->compact_sequences_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compact_sequences_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compact_sequences_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->proton_ = 1.00727;
  this->hydrogen_ = 1.00782;
  this->oxygen_ = 15.99491;
  this->water_ = 18.01055;
  memcpy(&pool,&DAT_0013c460,0x130);
  iVar10 = 0;
  std::
  _Hashtable<char,std::pair<char_const,double>,std::allocator<std::pair<char_const,double>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<char_const,double>const*>
            ((_Hashtable<char,std::pair<char_const,double>,std::allocator<std::pair<char_const,double>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->mass_table_,&pool,&stack0xffffffffffffffd0,0,&local_179,&local_17a,&local_17b
            );
  pPVar2 = (proteins->proteins_).
           super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar1 = (proteins->proteins_).
           super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pPVar6 = pPVar1; pPVar6 != pPVar2; pPVar6 = pPVar6 + 1) {
    iVar10 = iVar10 + (int)pPVar6->sequence_length;
  }
  local_170 = &this->mass_table_;
  std::vector<char,_std::allocator<char>_>::resize
            (this_00,(long)iVar10 + ((long)pPVar2 - (long)pPVar1) / 0x18);
  pool._M_h._M_buckets = &pool._M_h._M_single_bucket;
  pool._M_h._M_bucket_count = 1;
  pool._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pool._M_h._M_element_count = 0;
  pool._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pool._M_h._M_rehash_policy._M_next_resize = 0;
  pool._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_168 = (proteins->proteins_).
              super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
              super__Vector_impl_data._M_finish;
  lVar9 = 0;
  for (protein_00 = (proteins->proteins_).
                    super__Vector_base<PPData::Protein,_std::allocator<PPData::Protein>_>._M_impl.
                    super__Vector_impl_data._M_start; protein_00 != local_168;
      protein_00 = protein_00 + 1) {
    pcVar3 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = (int)lVar9;
    lVar5 = lVar9 << 0x20;
    uVar7 = 0;
    lVar4 = (long)iVar10;
    while( true ) {
      lVar9 = lVar4 + 1;
      if (protein_00->sequence_length <= (ulong)uVar7) break;
      cVar8 = 'L';
      if (protein_00->sequence[uVar7] != 'I') {
        cVar8 = protein_00->sequence[uVar7];
      }
      (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = cVar8;
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x100000000;
      lVar4 = lVar9;
    }
    (this->compact_sequences_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5 >> 0x20] = '\0';
    Digest(this,&pool,protein_00,pcVar3 + iVar10);
  }
  std::vector<PPData::Peptide,std::allocator<PPData::Peptide>>::
  insert<std::__detail::_Node_iterator<PPData::Peptide,true,true>,void>
            (local_178,
             (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (_Node_iterator<PPData::Peptide,_true,_true>)pool._M_h._M_before_begin._M_nxt,
             (_Node_iterator<PPData::Peptide,_true,_true>)0x0);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<PPData::Peptide*,std::vector<PPData::Peptide,std::allocator<PPData::Peptide>>>,__gnu_cxx::__ops::_Iter_comp_iter<PeptData::PeptData(ProtData_const&,PPData::EnzymeType,unsigned_int,double,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            ((this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->peptides_).super__Vector_base<PPData::Peptide,_std::allocator<PPData::Peptide>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Hashtable<PPData::Peptide,_PPData::Peptide,_std::allocator<PPData::Peptide>,_std::__detail::_Identity,_std::equal_to<PPData::Peptide>,_std::hash<PPData::Peptide>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&pool._M_h);
  return;
}

Assistant:

PeptData(const ProtData& proteins, EnzymeType enzyme_type, unsigned max_miss_cleavage,
             double min_mass, double max_mass)
            : enzyme_type_(enzyme_type), max_miss_cleavage_(max_miss_cleavage),
              min_mass_(min_mass), max_mass_(max_mass) {
        // calculate compact size
        auto sequences_len_sum = std::accumulate(proteins.begin(), proteins.end(), 0,
            [](const int& sum, const Protein& protein) {
                return sum + protein.sequence_length;
            }
        );
        auto compact_size = sequences_len_sum + proteins.size();  // append '\0' at the end of each sequence
        compact_sequences_.resize(compact_size);

        // build compact sequences and peptides
        std::unordered_set<Peptide> pool;
        int index = 0;
        for (auto& protein : proteins) {
            // fill compact sequence
            const char* compact_sequence = &compact_sequences_[index];
            for (unsigned i = 0; i < protein.sequence_length; ++i) {
                compact_sequences_[index++] = protein.sequence[i] == 'I' ? 'L' : protein.sequence[i];
            }  // prefer L
            compact_sequences_[index++] = '\0';

            // digest and build peptides into pool
            Digest(pool, protein, compact_sequence);
        }

        peptides_.insert(peptides_.end(), pool.begin(), pool.end());
        std::stable_sort(peptides_.begin(), peptides_.end(),
                  [](const auto& one, const auto& another) { return one.mass < another.mass; });
    }